

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# painter.cpp
# Opt level: O0

void __thiscall cppurses::Painter::Painter(Painter *this,Widget *widg)

{
  bool bVar1;
  size_t sVar2;
  Map_t *this_00;
  mapped_type *pmVar3;
  Widget *local_20;
  Widget *local_18;
  Widget *widg_local;
  Painter *this_local;
  
  this->widget_ = widg;
  local_18 = widg;
  widg_local = (Widget *)this;
  sVar2 = Widget::width(this->widget_);
  (this->inner_area_).width = sVar2;
  sVar2 = Widget::height(this->widget_);
  (this->inner_area_).height = sVar2;
  bVar1 = detail::is_paintable(this->widget_);
  this->is_paintable_ = bVar1;
  this_00 = detail::Staged_changes::get();
  local_20 = local_18;
  pmVar3 = std::
           unordered_map<cppurses::Widget_*,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>,_std::hash<cppurses::Widget_*>,_std::equal_to<cppurses::Widget_*>,_std::allocator<std::pair<cppurses::Widget_*const,_std::unordered_map<cppurses::Point,_cppurses::Glyph,_std::hash<cppurses::Point>,_std::equal_to<cppurses::Point>,_std::allocator<std::pair<const_cppurses::Point,_cppurses::Glyph>_>_>_>_>_>
           ::operator[](this_00,&local_20);
  this->staged_changes_ = pmVar3;
  return;
}

Assistant:

Painter::Painter(Widget& widg)
    : widget_{widg},
      inner_area_{widget_.width(), widget_.height()},
      is_paintable_{detail::is_paintable(widget_)},
      staged_changes_{detail::Staged_changes::get()[&widg]}
{}